

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<int>::test_all_algorithms(DivideTest<int> *this,int denom,set_t<int> *tested_denom)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  int local_1c;
  
  p_Var1 = &(tested_denom->_M_t)._M_impl.super__Rb_tree_header;
  p_Var2 = (tested_denom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
      p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < denom]) {
    if (denom <= (int)*(size_t *)(p_Var2 + 1)) {
      p_Var3 = p_Var2;
    }
  }
  p_Var4 = p_Var1;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = (_Rb_tree_header *)p_Var3, denom < (int)((_Rb_tree_header *)p_Var3)->_M_node_count))
  {
    p_Var4 = p_Var1;
  }
  if (p_Var1 == p_Var4) {
    local_1c = denom;
    test_many<(libdivide::Branching)0>(this,denom);
    test_many<(libdivide::Branching)1>(this,local_1c);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               tested_denom,&local_1c);
  }
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }